

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::EnableDisableAttributesTest::PrepareVAO
          (EnableDisableAttributesTest *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ulong uVar6;
  void *pvVar7;
  undefined4 *puVar8;
  int local_28;
  int local_24;
  GLint i_1;
  GLint i;
  GLint *reference_data;
  Functions *gl;
  EnableDisableAttributesTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x708))(1,&this->m_vao);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1df);
  (**(code **)(lVar5 + 0xd8))(this->m_vao);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1e2);
  (**(code **)(lVar5 + 0x6c8))(1,&this->m_bo);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1e6);
  (**(code **)(lVar5 + 0x40))(0x8892,this->m_bo);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1e9);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->m_max_attributes;
  uVar6 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  if (pvVar7 == (void *)0x0) {
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0;
    __cxa_throw(puVar8,&int::typeinfo,0);
  }
  for (local_24 = 0; local_24 < this->m_max_attributes; local_24 = local_24 + 1) {
    *(int *)((long)pvVar7 + (long)local_24 * 4) = local_24;
  }
  (**(code **)(lVar5 + 0x150))(0x8892,(long)this->m_max_attributes << 2,pvVar7,0x88e4);
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1fb);
  for (local_28 = 0; local_28 < this->m_max_attributes; local_28 = local_28 + 1) {
    (**(code **)(lVar5 + 0x1958))
              (local_28,1,0x1404,(long)this->m_max_attributes << 2,(long)local_28 * 4);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glVertexAttribIPointer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x203);
  }
  return;
}

Assistant:

void EnableDisableAttributesTest::PrepareVAO()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* VAO creation. */
	gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Buffer creation. */
	gl.genBuffers(1, &m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	glw::GLint* reference_data = new glw::GLint[m_max_attributes];

	if (DE_NULL == reference_data)
	{
		throw 0;
	}

	for (glw::GLint i = 0; i < m_max_attributes; ++i)
	{
		reference_data[i] = i;
	}

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLint) * m_max_attributes, reference_data, GL_STATIC_DRAW);

	delete[] reference_data;

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	/* VAO setup. */
	for (glw::GLint i = 0; i < m_max_attributes; ++i)
	{
		gl.vertexAttribIPointer(i, 1, GL_INT, static_cast<glw::GLsizei>(sizeof(glw::GLint) * m_max_attributes),
								(glw::GLvoid*)((glw::GLint*)NULL + i));

		GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribIPointer call failed.");
	}
}